

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O1

double sse_to_psnr(double samples,double peak,double sse)

{
  double dVar1;
  double dVar2;
  
  if (0.0 < sse) {
    dVar1 = log10((samples * peak * peak) / sse);
    dVar2 = 100.0;
    if (dVar1 * 10.0 <= 100.0) {
      dVar2 = dVar1 * 10.0;
    }
    return dVar2;
  }
  return 100.0;
}

Assistant:

double sse_to_psnr(double samples, double peak, double sse) {
  static const double kMaxPSNR = 100.0;

  if (sse > 0.0) {
    const double psnr = 10.0 * log10(samples * peak * peak / sse);
    return psnr > kMaxPSNR ? kMaxPSNR : psnr;
  } else {
    return kMaxPSNR;
  }
}